

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader_utilities.cpp
# Opt level: O2

void ShaderUtilities::attach_point_light(GLuint p_shader_id,PointLight *point_light)

{
  allocator<char> local_51;
  vec3 local_50;
  string local_40;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"point_light.position",(allocator<char> *)&local_50);
  setVec3(p_shader_id,&local_40,&point_light->m_position);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"point_light.ambient",&local_51);
  if (LightingDbWindow::enable_point_light == '\x01') {
    local_50.field_2 = (point_light->m_phong).m_ambient.field_2;
    local_50.field_0 = (point_light->m_phong).m_ambient.field_0;
    local_50.field_1 = (point_light->m_phong).m_ambient.field_1;
  }
  else {
    local_50.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x0;
    local_50.field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x0;
    local_50.field_2.z = 0.0;
  }
  setVec3(p_shader_id,&local_40,&local_50);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"point_light.diffuse",&local_51);
  if (LightingDbWindow::enable_point_light == '\x01') {
    local_50.field_2 = (point_light->m_phong).m_diffuse.field_2;
    local_50.field_0 = (point_light->m_phong).m_diffuse.field_0;
    local_50.field_1 = (point_light->m_phong).m_diffuse.field_1;
  }
  else {
    local_50.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x0;
    local_50.field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x0;
    local_50.field_2.z = 0.0;
  }
  setVec3(p_shader_id,&local_40,&local_50);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"point_light.specular",&local_51);
  if (LightingDbWindow::enable_point_light == '\x01') {
    local_50.field_2 = (point_light->m_phong).m_specular.field_2;
    local_50.field_0 = (point_light->m_phong).m_specular.field_0;
    local_50.field_1 = (point_light->m_phong).m_specular.field_1;
  }
  else {
    local_50.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x0;
    local_50.field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x0;
    local_50.field_2.z = 0.0;
  }
  setVec3(p_shader_id,&local_40,&local_50);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"point_light.attenuation_value",(allocator<char> *)&local_50);
  setFloat(p_shader_id,&local_40,(point_light->m_intensity).m_attval);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"point_light.constant",(allocator<char> *)&local_50);
  setFloat(p_shader_id,&local_40,(point_light->m_intensity).m_constant);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"point_light.linear",(allocator<char> *)&local_50);
  setFloat(p_shader_id,&local_40,(point_light->m_intensity).m_linear);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"point_light.quadratic",(allocator<char> *)&local_50);
  setFloat(p_shader_id,&local_40,(point_light->m_intensity).m_quadratic);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"depth_map",(allocator<char> *)&local_50);
  setInt(p_shader_id,&local_40,4);
  std::__cxx11::string::~string((string *)&local_40);
  (*glad_glActiveTexture)(0x84c4);
  (*glad_glBindTexture)(0x8513,(point_light->m_buffer).m_cube_map);
  return;
}

Assistant:

void ShaderUtilities::attach_point_light(
    const GLuint p_shader_id,
    const PointLight &point_light) noexcept
{
    setVec3(
        p_shader_id,
        "point_light.position",
        point_light.m_position);
    setVec3(
        p_shader_id,
        "point_light.ambient",
        LightingDbWindow::enable_point_light ? point_light.m_phong.m_ambient
                                             : glm::vec3(0.0f));
    setVec3(
        p_shader_id,
        "point_light.diffuse",
        LightingDbWindow::enable_point_light ? point_light.m_phong.m_diffuse
                                             : glm::vec3(0.0f));
    setVec3(
        p_shader_id,
        "point_light.specular",
        LightingDbWindow::enable_point_light ? point_light.m_phong.m_specular
                                             : glm::vec3(0.0f));
    setFloat(
        p_shader_id,
        "point_light.attenuation_value",
        point_light.m_intensity.m_attval);
    setFloat(
        p_shader_id,
        "point_light.constant",
        point_light.m_intensity.m_constant);
    setFloat(
        p_shader_id,
        "point_light.linear",
        point_light.m_intensity.m_linear);
    setFloat(
        p_shader_id,
        "point_light.quadratic",
        point_light.m_intensity.m_quadratic);
    ShaderUtilities::setInt(
        p_shader_id,
        "depth_map",
        4);
    glActiveTexture(GL_TEXTURE4);
    glBindTexture(GL_TEXTURE_CUBE_MAP, point_light.m_buffer.m_cube_map);
}